

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int handleDeferredMoveto(VdbeCursor *p)

{
  int iVar1;
  undefined8 in_RAX;
  int res;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = sqlite3BtreeMovetoUnpacked
                    ((p->uc).pCursor,(UnpackedRecord *)0x0,p->movetoTarget,0,&local_14);
  if (iVar1 == 0) {
    if (local_14 == 0) {
      p->deferredMoveto = '\0';
      p->cacheStatus = 0;
      iVar1 = 0;
    }
    else {
      iVar1 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1378f,
                  "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    }
  }
  return iVar1;
}

Assistant:

static int SQLITE_NOINLINE handleDeferredMoveto(VdbeCursor *p){
  int res, rc;
#ifdef SQLITE_TEST
  extern int sqlite3_search_count;
#endif
  assert( p->deferredMoveto );
  assert( p->isTable );
  assert( p->eCurType==CURTYPE_BTREE );
  rc = sqlite3BtreeMovetoUnpacked(p->uc.pCursor, 0, p->movetoTarget, 0, &res);
  if( rc ) return rc;
  if( res!=0 ) return SQLITE_CORRUPT_BKPT;
#ifdef SQLITE_TEST
  sqlite3_search_count++;
#endif
  p->deferredMoveto = 0;
  p->cacheStatus = CACHE_STALE;
  return SQLITE_OK;
}